

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O1

ZyanStatus
ZyanVectorFindEx(ZyanVector *vector,void *element,ZyanISize *found_index,
                ZyanEqualityComparison comparison,ZyanUSize index,ZyanUSize count)

{
  ulong uVar1;
  ZyanBool ZVar2;
  ZyanStatus ZVar3;
  long lVar4;
  bool bVar5;
  
  if (vector == (ZyanVector *)0x0) {
    ZVar3 = 0x80100004;
  }
  else {
    uVar1 = count + index;
    ZVar3 = 0x80100008;
    if (vector->size != index && uVar1 <= vector->size) {
      if (count != 0) {
        if (vector->element_size == 0) {
          __assert_fail("vector->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x29f,
                        "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                       );
        }
        if (vector->data == (void *)0x0) {
          __assert_fail("vector->data",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x2a0,
                        "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                       );
        }
        bVar5 = index < uVar1;
        if (index < uVar1) {
          ZVar2 = (*comparison)((void *)(vector->element_size * index + (long)vector->data),element)
          ;
          if (ZVar2 == '\0') {
            lVar4 = count - 1;
            do {
              bVar5 = lVar4 == 0;
              lVar4 = lVar4 + -1;
              if (bVar5) goto LAB_0010e21f;
              index = index + 1;
              ZVar2 = (*comparison)((void *)(vector->element_size * index + (long)vector->data),
                                    element);
            } while (ZVar2 == '\0');
            bVar5 = index < uVar1;
          }
          *found_index = index;
          if (bVar5) {
            return 0x100002;
          }
        }
      }
LAB_0010e21f:
      *found_index = -1;
      ZVar3 = 0x100003;
    }
  }
  return ZVar3;
}

Assistant:

ZyanStatus ZyanVectorFindEx(const ZyanVector* vector, const void* element, ZyanISize* found_index,
    ZyanEqualityComparison comparison, ZyanUSize index, ZyanUSize count)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if ((index + count > vector->size) || (index == vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (!count)
    {
        *found_index = -1;
        return ZYAN_STATUS_FALSE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    for (ZyanUSize i = index; i < index + count; ++i)
    {
        if (comparison(ZYCORE_VECTOR_OFFSET(vector, i), element))
        {
            *found_index = i;
            return ZYAN_STATUS_TRUE;
        }
    }

    *found_index = -1;
    return ZYAN_STATUS_FALSE;
}